

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.h
# Opt level: O2

unsigned_long
Js::JavascriptArray::GetFromIndex<unsigned_long>
          (Var arg,unsigned_long length,ScriptContext *scriptContext,bool addWithLength)

{
  bool bVar1;
  int64 iVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  double dVar5;
  double dVar6;
  undefined4 uVar9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  bVar1 = TaggedInt::Is(arg);
  if (bVar1) {
    iVar2 = TaggedInt::ToInt64(arg);
    dVar5 = (double)iVar2;
  }
  else {
    dVar5 = JavascriptConversion::ToInteger(arg,scriptContext);
  }
  uVar9 = (undefined4)(length >> 0x20);
  if (0.0 <= dVar5) {
    auVar8._8_4_ = uVar9;
    auVar8._0_8_ = length;
    auVar8._12_4_ = 0x45300000;
    dVar6 = ((double)CONCAT44(0x43300000,(int)length) - 4503599627370496.0) +
            (auVar8._8_8_ - 1.9342813113834067e+25);
    if (dVar6 <= dVar5) {
      dVar5 = dVar6;
    }
    uVar3 = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
  }
  else if (addWithLength) {
    auVar7._8_4_ = uVar9;
    auVar7._0_8_ = length;
    auVar7._12_4_ = 0x45300000;
    uVar4 = (unsigned_long)
            (dVar5 + ((double)CONCAT44(0x43300000,(int)length) - 4503599627370496.0) +
                     (auVar7._8_8_ - 1.9342813113834067e+25));
    uVar3 = 0;
    if (0 < (long)uVar4) {
      uVar3 = uVar4;
    }
  }
  else {
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

static T GetFromIndex(Var arg, T length, ScriptContext *scriptContext, bool addWithLength = true)
        {
            T fromIndex = 0;

            double value = TaggedInt::Is(arg) ? (double)TaggedInt::ToInt64(arg) : JavascriptConversion::ToInteger(arg, scriptContext);

            if (value < 0)
            {
                fromIndex = addWithLength ? (T)max(0i64, (int64)(value + length)) : 0;
            }
            else
            {
                fromIndex = (T)min(value, (double)length);
            }
            return fromIndex;
        }